

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

filemgr_open_result
filemgr_open(char *filename,filemgr_ops *ops,filemgr_config *config,err_log_callback *log_callback)

{
  filemgr_header_revnum_t fVar1;
  uint8_t uVar2;
  uint32_t uVar3;
  undefined4 uVar4;
  int iVar5;
  hash_elem *phVar6;
  filemgr *pfVar7;
  size_t sVar8;
  char *pcVar9;
  wal *pwVar10;
  filemgr_config *pfVar11;
  list *plVar12;
  uint64_t uVar13;
  wal_txn_wrapper *pwVar14;
  err_log_callback *in_RCX;
  long in_RDX;
  filemgr_ops *in_RSI;
  char *in_RDI;
  filemgr_open_result fVar15;
  plock_config pconfig;
  plock_ops pops;
  cs_off_t offset;
  hash_elem *ret;
  fdb_status status;
  int fd;
  int file_flag;
  bool create;
  hash_elem *e;
  filemgr query;
  filemgr *file;
  filemgr_open_result result;
  __pointer_type in_stack_fffffffffffffc08;
  memory_order order;
  filemgr *in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc18;
  int in_stack_fffffffffffffc1c;
  undefined4 in_stack_fffffffffffffc20;
  int in_stack_fffffffffffffc24;
  hash *in_stack_fffffffffffffc28;
  char *in_stack_fffffffffffffc30;
  code **local_3c0;
  undefined8 local_3b8;
  undefined8 local_3b0;
  undefined8 local_3a8;
  undefined8 local_3a0;
  code *local_398;
  code *local_390;
  code *local_388;
  code *local_380;
  code *local_378;
  code *local_370;
  code *local_368;
  code *local_360;
  code *local_358;
  cs_off_t local_350;
  hash_elem *local_348;
  fdb_status local_340;
  fdb_status local_33c;
  uint local_338;
  byte local_331;
  hash_elem *local_330;
  err_log_callback *in_stack_fffffffffffffda0;
  filemgr *in_stack_fffffffffffffda8;
  char *in_stack_fffffffffffffe28;
  char *in_stack_fffffffffffffe30;
  fdb_status in_stack_fffffffffffffe3c;
  err_log_callback *in_stack_fffffffffffffe40;
  filemgr_ops *in_stack_fffffffffffffe48;
  filemgr *local_10;
  fdb_status local_8;
  
  local_330 = (hash_elem *)0x0;
  local_331 = (*(byte *)(in_RDX + 0x10) & 8) != 0;
  local_338 = 0;
  local_33c = 0xffffffff;
  local_10 = (filemgr *)0x0;
  filemgr_init((filemgr_config *)in_stack_fffffffffffffc10);
  if ((*(int *)(in_RDX + 0x24) != 0) && (global_config.ncacheblock < 1)) {
    local_8 = FDB_RESULT_CRYPTO_ERROR;
    goto LAB_00126813;
  }
  pthread_spin_lock(&filemgr_openlock);
  phVar6 = hash_find((hash *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                     (hash_elem *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  local_330 = phVar6;
  if (phVar6 != (hash_elem *)0x0) {
    pfVar7 = (filemgr *)(phVar6 + -10);
    uVar3 = atomic_incr_uint32_t
                      ((atomic<unsigned_int> *)in_stack_fffffffffffffc10,
                       (memory_order)((ulong)in_stack_fffffffffffffc08 >> 0x20));
    if ((1 < uVar3) &&
       (uVar2 = atomic_get_uint8_t((atomic<unsigned_char> *)in_stack_fffffffffffffc10,
                                   (memory_order)((ulong)in_stack_fffffffffffffc08 >> 0x20)),
       uVar2 != '\x03')) {
      pthread_spin_unlock(&filemgr_openlock);
      local_8 = FDB_RESULT_SUCCESS;
      local_10 = pfVar7;
      goto LAB_00126813;
    }
    pthread_spin_lock((pthread_spinlock_t *)&phVar6[7].avl.left);
    uVar2 = atomic_get_uint8_t((atomic<unsigned_char> *)in_stack_fffffffffffffc10,
                               (memory_order)((ulong)in_stack_fffffffffffffc08 >> 0x20));
    if (uVar2 != '\x03') {
      if ((*(byte *)(in_RDX + 0x10) & 1) == 0) {
        *(byte *)((long)&phVar6[-10].avl.left + 4) =
             *(byte *)((long)&phVar6[-10].avl.left + 4) & 0xfe;
      }
      else {
        *(byte *)((long)&phVar6[-10].avl.left + 4) = *(byte *)((long)&phVar6[-10].avl.left + 4) | 1;
      }
      pthread_spin_unlock((pthread_spinlock_t *)&phVar6[7].avl.left);
      pthread_spin_unlock(&filemgr_openlock);
      local_8 = FDB_RESULT_SUCCESS;
      local_10 = pfVar7;
      goto LAB_00126813;
    }
    local_338 = 2;
    if ((local_331 & 1) != 0) {
      local_338 = 0x42;
    }
    filemgr_config::operator=
              ((filemgr_config *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
               (filemgr_config *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
    *(int *)&(phVar6[1].avl.left)->parent = global_config.blocksize;
    *(int *)((long)&(phVar6[1].avl.left)->parent + 4) = global_config.ncacheblock;
    local_338 = *(uint *)(in_RDX + 8) | local_338;
    uVar4 = (*(code *)(phVar6[-1].avl.right)->parent)
                      (((avl_node *)&pfVar7->filename)->parent,local_338,0x1b6);
    *(undefined4 *)((long)&phVar6[-10].avl.right + 4) = uVar4;
    if (-1 < *(int *)((long)&phVar6[-10].avl.right + 4)) {
      atomic_store_uint8_t
                ((atomic<unsigned_char> *)in_stack_fffffffffffffc10,
                 (uint8_t)((ulong)in_stack_fffffffffffffc08 >> 0x38),
                 (memory_order)in_stack_fffffffffffffc08);
      if ((*(byte *)(in_RDX + 0x10) & 1) == 0) {
        *(byte *)((long)&phVar6[-10].avl.left + 4) =
             *(byte *)((long)&phVar6[-10].avl.left + 4) & 0xfe;
      }
      else {
        *(byte *)((long)&phVar6[-10].avl.left + 4) = *(byte *)((long)&phVar6[-10].avl.left + 4) | 1;
      }
      pthread_spin_unlock((pthread_spinlock_t *)&phVar6[7].avl.left);
      pthread_spin_unlock(&filemgr_openlock);
      local_8 = FDB_RESULT_SUCCESS;
      local_10 = pfVar7;
      goto LAB_00126813;
    }
    if (*(int *)((long)&phVar6[-10].avl.right + 4) != -3) {
      _log_errno_str(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,
                     in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      atomic_decr_uint32_t
                ((atomic<unsigned_int> *)in_stack_fffffffffffffc10,
                 (memory_order)((ulong)in_stack_fffffffffffffc08 >> 0x20));
      pthread_spin_unlock((pthread_spinlock_t *)&phVar6[7].avl.left);
      pthread_spin_unlock(&filemgr_openlock);
      local_8 = *(fdb_status *)((long)&phVar6[-10].avl.right + 4);
      goto LAB_00126813;
    }
    pthread_spin_unlock((pthread_spinlock_t *)&phVar6[7].avl.left);
    local_348 = hash_remove(in_stack_fffffffffffffc28,
                            (hash_elem *)
                            CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
    if (local_348 == (hash_elem *)0x0) {
      fdb_assert_die(in_stack_fffffffffffffc30,(char *)in_stack_fffffffffffffc28,
                     in_stack_fffffffffffffc24,
                     CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                     (uint64_t)in_stack_fffffffffffffc10);
    }
    filemgr_free_func((hash_elem *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
    if ((local_331 & 1) == 0) {
      _log_errno_str(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,
                     in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      pthread_spin_unlock(&filemgr_openlock);
      local_8 = FDB_RESULT_NO_SUCH_FILE;
      goto LAB_00126813;
    }
  }
  local_338 = 2;
  if ((local_331 & 1) != 0) {
    local_338 = 0x42;
  }
  local_338 = *(uint *)(in_RDX + 8) | local_338;
  local_33c = (*in_RSI->open)(in_RDI,local_338,0x1b6);
  if (local_33c < FDB_RESULT_SUCCESS) {
    _log_errno_str(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,
                   in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    pthread_spin_unlock(&filemgr_openlock);
    local_8 = local_33c;
  }
  else {
    pfVar7 = (filemgr *)calloc(1,0x2f0);
    sVar8 = strlen(in_RDI);
    pfVar7->filename_len = (uint16_t)sVar8;
    pcVar9 = (char *)malloc((long)(int)(pfVar7->filename_len + 1));
    pfVar7->filename = pcVar9;
    strcpy(pfVar7->filename,in_RDI);
    atomic_init_uint32_t
              ((atomic<unsigned_int> *)in_stack_fffffffffffffc10,
               (uint32_t)((ulong)in_stack_fffffffffffffc08 >> 0x20));
    pfVar7->stale_list = (list *)0x0;
    local_340 = fdb_init_encryptor((encryptor *)in_stack_fffffffffffffc08,
                                   (fdb_encryption_key *)0x125d8b);
    if (local_340 == FDB_RESULT_SUCCESS) {
      pwVar10 = (wal *)calloc(1,0x68);
      pfVar7->wal = pwVar10;
      pfVar7->wal->flag = '\0';
      pfVar7->ops = in_RSI;
      pfVar7->blocksize = global_config.blocksize;
      atomic_init_uint8_t((atomic<unsigned_char> *)in_stack_fffffffffffffc10,
                          (uint8_t)((ulong)in_stack_fffffffffffffc08 >> 0x38));
      pfVar11 = (filemgr_config *)malloc(0x60);
      pfVar7->config = pfVar11;
      filemgr_config::operator=
                ((filemgr_config *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                 (filemgr_config *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
      pfVar7->config->blocksize = global_config.blocksize;
      pfVar7->config->ncacheblock = global_config.ncacheblock;
      pfVar7->old_filename = (char *)0x0;
      pfVar7->new_filename = (char *)0x0;
      pfVar7->fd = local_33c;
      local_350 = (*pfVar7->ops->goto_eof)(pfVar7->fd);
      if (local_350 < 0) {
        _log_errno_str(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c
                       ,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
        (*pfVar7->ops->close)(pfVar7->fd);
        free(pfVar7->wal);
        free(pfVar7->filename);
        free(pfVar7->config);
        free(pfVar7);
        pthread_spin_unlock(&filemgr_openlock);
        local_8 = (fdb_status)local_350;
      }
      else {
        atomic_init_uint64_t
                  ((atomic<unsigned_long> *)in_stack_fffffffffffffc10,
                   (uint64_t)in_stack_fffffffffffffc08);
        atomic_init_uint64_t
                  ((atomic<unsigned_long> *)in_stack_fffffffffffffc10,
                   (uint64_t)in_stack_fffffffffffffc08);
        atomic_init_uint64_t
                  ((atomic<unsigned_long> *)in_stack_fffffffffffffc10,
                   (uint64_t)in_stack_fffffffffffffc08);
        atomic_init_uint64_t
                  ((atomic<unsigned_long> *)in_stack_fffffffffffffc10,
                   (uint64_t)in_stack_fffffffffffffc08);
        atomic_init_uint32_t
                  ((atomic<unsigned_int> *)in_stack_fffffffffffffc10,
                   (uint32_t)((ulong)in_stack_fffffffffffffc08 >> 0x20));
        atomic_init_uint64_t
                  ((atomic<unsigned_long> *)in_stack_fffffffffffffc10,
                   (uint64_t)in_stack_fffffffffffffc08);
        atomic_init_uint8_t((atomic<unsigned_char> *)in_stack_fffffffffffffc10,
                            (uint8_t)((ulong)in_stack_fffffffffffffc08 >> 0x38));
        std::atomic<fnamedic_item_*>::operator=
                  ((atomic<fnamedic_item_*> *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
        pfVar7->in_place_compaction = false;
        pfVar7->kv_header = (kvs_header *)0x0;
        atomic_init_uint8_t((atomic<unsigned_char> *)in_stack_fffffffffffffc10,
                            (uint8_t)((ulong)in_stack_fffffffffffffc08 >> 0x38));
        atomic_init_uint64_t
                  ((atomic<unsigned_long> *)in_stack_fffffffffffffc10,
                   (uint64_t)in_stack_fffffffffffffc08);
        _init_op_stats((kvs_ops_stat *)0x1260f1);
        pthread_spin_init(&pfVar7->lock,1);
        plVar12 = (list *)calloc(1,0x10);
        pfVar7->stale_list = plVar12;
        list_init(pfVar7->stale_list);
        avl_init(&pfVar7->stale_info_tree,(void *)0x0);
        avl_init(&pfVar7->mergetree,(void *)0x0);
        std::atomic<bool>::operator=
                  ((atomic<bool> *)in_stack_fffffffffffffc10,
                   SUB81((ulong)in_stack_fffffffffffffc08 >> 0x38,0));
        filemgr_dirty_update_init((filemgr *)0x126192);
        pthread_spin_init(&pfVar7->fhandle_idx_lock,1);
        avl_init(&pfVar7->fhandle_idx,(void *)0x0);
        local_398 = mutex_init_wrap;
        local_390 = mutex_lock_wrap;
        local_388 = mutex_unlock_wrap;
        local_380 = mutex_destroy_wrap;
        local_378 = spin_init_wrap;
        local_370 = spin_lock_wrap;
        local_368 = spin_unlock_wrap;
        local_360 = spin_destroy_wrap;
        local_358 = _block_is_overlapped;
        memset(&local_3c0,0,0x28);
        local_3c0 = &local_398;
        local_3b0 = 4;
        local_3b8 = 0x28;
        local_3a8 = 8;
        local_3a0 = 0;
        plock_init((plock *)in_stack_fffffffffffffc08,(plock_config *)0x126296);
        pthread_mutex_init((pthread_mutex_t *)&pfVar7->writer_lock,(pthread_mutexattr_t *)0x0);
        (pfVar7->writer_lock).locked = false;
        if ((pfVar7->config == (filemgr_config *)0x0) || ((pfVar7->config->options & 0x20) == 0)) {
          pfVar7->crc_mode = CRC32;
        }
        else {
          pfVar7->crc_mode = CRC32;
        }
        do {
          local_340 = _filemgr_load_sb(in_stack_fffffffffffffc10,
                                       (err_log_callback *)in_stack_fffffffffffffc08);
          if ((local_340 != FDB_RESULT_SB_READ_FAIL) && (local_340 != FDB_RESULT_SUCCESS)) {
            _log_errno_str(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                           in_stack_fffffffffffffe3c,in_stack_fffffffffffffe30,
                           in_stack_fffffffffffffe28);
            (*pfVar7->ops->close)(pfVar7->fd);
            free(pfVar7->stale_list);
            free(pfVar7->wal);
            free(pfVar7->filename);
            free(pfVar7->config);
            free(pfVar7);
            pthread_spin_unlock(&filemgr_openlock);
            local_8 = local_340;
            goto LAB_00126813;
          }
          local_340 = _filemgr_read_header(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
          if (((pfVar7->sb == (superblock *)0x0) || (local_340 != FDB_RESULT_NO_DB_HEADERS)) &&
             (local_340 != FDB_RESULT_SUCCESS)) {
            _log_errno_str(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                           in_stack_fffffffffffffe3c,in_stack_fffffffffffffe30,
                           in_stack_fffffffffffffe28);
            (*pfVar7->ops->close)(pfVar7->fd);
            if (pfVar7->sb != (superblock *)0x0) {
              (*sb_ops.release)(pfVar7);
            }
            free(pfVar7->stale_list);
            free(pfVar7->wal);
            free(pfVar7->filename);
            free(pfVar7->config);
            free(pfVar7);
            pthread_spin_unlock(&filemgr_openlock);
            local_8 = local_340;
            goto LAB_00126813;
          }
        } while ((pfVar7->sb != (superblock *)0x0) &&
                (fVar1 = (pfVar7->header).revnum,
                uVar13 = atomic_get_uint64_t((atomic<unsigned_long> *)in_stack_fffffffffffffc10,
                                             (memory_order)
                                             ((ulong)in_stack_fffffffffffffc08 >> 0x20)),
                fVar1 != uVar13));
        iVar5 = wal_is_initialized(pfVar7);
        if (iVar5 == 0) {
          wal_init((filemgr *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                   in_stack_fffffffffffffc1c);
        }
        pwVar14 = (wal_txn_wrapper *)malloc(0x18);
        (pfVar7->global_txn).wrapper = pwVar14;
        (((pfVar7->global_txn).wrapper)->field_1).txn = &pfVar7->global_txn;
        (pfVar7->global_txn).handle = (fdb_kvs_handle *)0x0;
        uVar13 = atomic_get_uint64_t((atomic<unsigned_long> *)in_stack_fffffffffffffc10,
                                     (memory_order)((ulong)in_stack_fffffffffffffc08 >> 0x20));
        if (uVar13 == 0) {
          (pfVar7->global_txn).prev_hdr_bid = 0xffffffffffffffff;
        }
        else {
          uVar13 = atomic_get_uint64_t((atomic<unsigned_long> *)in_stack_fffffffffffffc10,
                                       (memory_order)((ulong)in_stack_fffffffffffffc08 >> 0x20));
          (pfVar7->global_txn).prev_hdr_bid = uVar13 / pfVar7->blocksize - 1;
        }
        (pfVar7->global_txn).prev_revnum = 0;
        plVar12 = (list *)malloc(0x10);
        (pfVar7->global_txn).items = plVar12;
        list_init((pfVar7->global_txn).items);
        (pfVar7->global_txn).isolation = '\x02';
        wal_add_transaction(in_stack_fffffffffffffc10,(fdb_txn *)in_stack_fffffffffffffc08);
        order = (memory_order)((ulong)in_stack_fffffffffffffc08 >> 0x20);
        hash_insert((hash *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                    (hash_elem *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
        if (*(long *)(in_RDX + 0x18) != 0) {
          filemgr_prefetch((filemgr *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                           (filemgr_config *)
                           CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                           (err_log_callback *)in_stack_fffffffffffffc10);
        }
        pthread_spin_unlock(&filemgr_openlock);
        if ((*(byte *)(in_RDX + 0x10) & 1) == 0) {
          pfVar7->fflags = pfVar7->fflags & 0xfe;
        }
        else {
          pfVar7->fflags = pfVar7->fflags | 1;
        }
        local_8 = FDB_RESULT_SUCCESS;
        uVar3 = atomic_get_uint32_t((atomic<unsigned_int> *)in_stack_fffffffffffffc10,order);
        fdb_log_impl(in_RCX,4,FDB_RESULT_SUCCESS,
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                     ,"filemgr_open",0x445,"Forestdb opened database file %s, ref count %zu",in_RDI,
                     uVar3);
        local_10 = pfVar7;
      }
    }
    else {
      (*in_RSI->close)(local_33c);
      free(pfVar7);
      pthread_spin_unlock(&filemgr_openlock);
      local_8 = local_340;
    }
  }
LAB_00126813:
  fVar15.rv = local_8;
  fVar15.file = local_10;
  fVar15._12_4_ = 0;
  return fVar15;
}

Assistant:

filemgr_open_result filemgr_open(char *filename, struct filemgr_ops *ops,
                                 struct filemgr_config *config,
                                 err_log_callback *log_callback)
{
    struct filemgr *file = NULL;
    struct filemgr query;
    struct hash_elem *e = NULL;
    bool create = config->options & FILEMGR_CREATE;
    int file_flag = 0x0;
    int fd = -1;
    fdb_status status;
    filemgr_open_result result = {NULL, FDB_RESULT_OPEN_FAIL};

    filemgr_init(config);

    if (config->encryption_key.algorithm != FDB_ENCRYPTION_NONE && global_config.ncacheblock <= 0) {
        // cannot use encryption without a block cache
        result.rv = FDB_RESULT_CRYPTO_ERROR;
        return result;
    }

    // check whether file is already opened or not
    query.filename = filename;
    spin_lock(&filemgr_openlock);
    e = hash_find(&hash, &query.e);

    if (e) {
        // already opened (return existing structure)
        file = _get_entry(e, struct filemgr, e);

        if (atomic_incr_uint32_t(&file->ref_count) > 1 &&
            atomic_get_uint8_t(&file->status) != FILE_CLOSED) {
            spin_unlock(&filemgr_openlock);
            result.file = file;
            result.rv = FDB_RESULT_SUCCESS;
            return result;
        }

        spin_lock(&file->lock);

        if (atomic_get_uint8_t(&file->status) == FILE_CLOSED) { // if file was closed before
            file_flag = O_RDWR;
            if (create) {
                file_flag |= O_CREAT;
            }
            *file->config = *config;
            file->config->blocksize = global_config.blocksize;
            file->config->ncacheblock = global_config.ncacheblock;
            file_flag |= config->flag;
            file->fd = file->ops->open(file->filename, file_flag, 0666);
            if (file->fd < 0) {
                if (file->fd == FDB_RESULT_NO_SUCH_FILE) {
                    // A database file was manually deleted by the user.
                    // Clean up global hash table, WAL index, and buffer cache.
                    // Then, retry it with a create option below IFF it is not
                    // a read-only open attempt
                    struct hash_elem *ret;
                    spin_unlock(&file->lock);
                    ret = hash_remove(&hash, &file->e);
                    fdb_assert(ret, 0, 0);
                    filemgr_free_func(&file->e);
                    if (!create) {
                        _log_errno_str(ops, log_callback,
                                FDB_RESULT_NO_SUCH_FILE, "OPEN", filename);
                        spin_unlock(&filemgr_openlock);
                        result.rv = FDB_RESULT_NO_SUCH_FILE;
                        return result;
                    }
                } else {
                    _log_errno_str(file->ops, log_callback,
                                  (fdb_status)file->fd, "OPEN", filename);
                    atomic_decr_uint32_t(&file->ref_count);
                    spin_unlock(&file->lock);
                    spin_unlock(&filemgr_openlock);
                    result.rv = file->fd;
                    return result;
                }
            } else { // Reopening the closed file is succeed.
                atomic_store_uint8_t(&file->status, FILE_NORMAL);
                if (config->options & FILEMGR_SYNC) {
                    file->fflags |= FILEMGR_SYNC;
                } else {
                    file->fflags &= ~FILEMGR_SYNC;
                }

                spin_unlock(&file->lock);
                spin_unlock(&filemgr_openlock);

                result.file = file;
                result.rv = FDB_RESULT_SUCCESS;
                return result;
            }
        } else { // file is already opened.

            if (config->options & FILEMGR_SYNC) {
                file->fflags |= FILEMGR_SYNC;
            } else {
                file->fflags &= ~FILEMGR_SYNC;
            }

            spin_unlock(&file->lock);
            spin_unlock(&filemgr_openlock);
            result.file = file;
            result.rv = FDB_RESULT_SUCCESS;
            return result;
        }
    }

    file_flag = O_RDWR;
    if (create) {
        file_flag |= O_CREAT;
    }
    file_flag |= config->flag;
    fd = ops->open(filename, file_flag, 0666);
    if (fd < 0) {
        _log_errno_str(ops, log_callback, (fdb_status)fd, "OPEN", filename);
        spin_unlock(&filemgr_openlock);
        result.rv = fd;
        return result;
    }
    file = (struct filemgr*)calloc(1, sizeof(struct filemgr));
    file->filename_len = strlen(filename);
    file->filename = (char*)malloc(file->filename_len + 1);
    strcpy(file->filename, filename);

    atomic_init_uint32_t(&file->ref_count, 1);
    file->stale_list = NULL;

    status = fdb_init_encryptor(&file->encryption, &config->encryption_key);
    if (status != FDB_RESULT_SUCCESS) {
        ops->close(fd);
        free(file);
        spin_unlock(&filemgr_openlock);
        result.rv = status;
        return result;
    }

    file->wal = (struct wal *)calloc(1, sizeof(struct wal));
    file->wal->flag = 0;

    file->ops = ops;
    file->blocksize = global_config.blocksize;
    atomic_init_uint8_t(&file->status, FILE_NORMAL);
    file->config = (struct filemgr_config*)malloc(sizeof(struct filemgr_config));
    *file->config = *config;
    file->config->blocksize = global_config.blocksize;
    file->config->ncacheblock = global_config.ncacheblock;
    file->old_filename = NULL;
    file->new_filename = NULL;
    file->fd = fd;

    cs_off_t offset = file->ops->goto_eof(file->fd);
    if (offset < 0) {
        _log_errno_str(file->ops, log_callback, (fdb_status) offset, "SEEK_END", filename);
        file->ops->close(file->fd);
        free(file->wal);
        free(file->filename);
        free(file->config);
        free(file);
        spin_unlock(&filemgr_openlock);
        result.rv = (fdb_status) offset;
        return result;
    }
    atomic_init_uint64_t(&file->last_commit, offset);
    atomic_init_uint64_t(&file->last_writable_bmp_revnum, 0);
    atomic_init_uint64_t(&file->pos, offset);
    atomic_init_uint64_t(&file->latest_filesize, offset);
    atomic_init_uint32_t(&file->throttling_delay, 0);
    atomic_init_uint64_t(&file->num_invalidated_blocks, 0);
    atomic_init_uint8_t(&file->io_in_prog, 0);

#ifdef _LATENCY_STATS
    for (int i = 0; i < FDB_LATENCY_NUM_STATS; ++i) {
        filemgr_init_latency_stat(&file->lat_stats[i]);
    }
#endif // _LATENCY_STATS

    file->bcache = NULL;
    file->in_place_compaction = false;
    file->kv_header = NULL;
    atomic_init_uint8_t(&file->prefetch_status, FILEMGR_PREFETCH_IDLE);

    atomic_init_uint64_t(&file->header.bid, 0);
    _init_op_stats(&file->header.op_stat);

    spin_init(&file->lock);
    file->stale_list = (struct list*)calloc(1, sizeof(struct list));
    list_init(file->stale_list);
    avl_init(&file->stale_info_tree, NULL);
    avl_init(&file->mergetree, NULL);
    file->stale_info_tree_loaded = false;

    filemgr_dirty_update_init(file);

    spin_init(&file->fhandle_idx_lock);
    avl_init(&file->fhandle_idx, NULL);

#ifdef __FILEMGR_DATA_PARTIAL_LOCK
    struct plock_ops pops;
    struct plock_config pconfig;

    pops.init_user = mutex_init_wrap;
    pops.lock_user = mutex_lock_wrap;
    pops.unlock_user = mutex_unlock_wrap;
    pops.destroy_user = mutex_destroy_wrap;
    pops.init_internal = spin_init_wrap;
    pops.lock_internal = spin_lock_wrap;
    pops.unlock_internal = spin_unlock_wrap;
    pops.destroy_internal = spin_destroy_wrap;
    pops.is_overlapped = _block_is_overlapped;

    memset(&pconfig, 0x0, sizeof(pconfig));
    pconfig.ops = &pops;
    pconfig.sizeof_lock_internal = sizeof(spin_t);
    pconfig.sizeof_lock_user = sizeof(mutex_t);
    pconfig.sizeof_range = sizeof(bid_t);
    pconfig.aux = NULL;
    plock_init(&file->plock, &pconfig);
#elif defined(__FILEMGR_DATA_MUTEX_LOCK)
    int i;
    for (i=0;i<DLOCK_MAX;++i) {
        mutex_init(&file->data_mutex[i]);
    }
#else
    int i;
    for (i=0;i<DLOCK_MAX;++i) {
        spin_init(&file->data_spinlock[i]);
    }
#endif //__FILEMGR_DATA_PARTIAL_LOCK

    mutex_init(&file->writer_lock.mutex);
    file->writer_lock.locked = false;

    // Note: CRC must be initialized before superblock loading
    // initialize CRC mode
    if (file->config && file->config->options & FILEMGR_CREATE_CRC32) {
        file->crc_mode = CRC32;
    } else {
        file->crc_mode = CRC_DEFAULT;
    }

    do { // repeat until both superblock and DB header are correctly read
        // init or load superblock
        status = _filemgr_load_sb(file, log_callback);
        // we can tolerate SB_READ_FAIL for old version file
        if (status != FDB_RESULT_SB_READ_FAIL &&
            status != FDB_RESULT_SUCCESS) {
            _log_errno_str(file->ops, log_callback, status, "READ", file->filename);
            file->ops->close(file->fd);
            free(file->stale_list);
            free(file->wal);
            free(file->filename);
            free(file->config);
            free(file);
            spin_unlock(&filemgr_openlock);
            result.rv = status;
            return result;
        }

        // read header
        status = _filemgr_read_header(file, log_callback);
        if (file->sb && status == FDB_RESULT_NO_DB_HEADERS) {
            // this happens when user created & closed a file without any mutations,
            // thus there is no other data but superblocks.
            // we can tolerate this case.
        } else if (status != FDB_RESULT_SUCCESS) {
            _log_errno_str(file->ops, log_callback, status, "READ", filename);
            file->ops->close(file->fd);
            if (file->sb) {
                sb_ops.release(file);
            }
            free(file->stale_list);
            free(file->wal);
            free(file->filename);
            free(file->config);
            free(file);
            spin_unlock(&filemgr_openlock);
            result.rv = status;
            return result;
        }

        if (file->sb &&
            file->header.revnum != atomic_get_uint64_t(&file->sb->last_hdr_revnum)) {
            // superblock exists but the corresponding DB header does not match.
            // read another candidate.
            continue;
        }

        break;
    } while (true);

    // initialize WAL
    if (!wal_is_initialized(file)) {
        wal_init(file, FDB_WAL_NBUCKET);
    }

    // init global transaction for the file
    file->global_txn.wrapper = (struct wal_txn_wrapper*)
                               malloc(sizeof(struct wal_txn_wrapper));
    file->global_txn.wrapper->txn = &file->global_txn;
    file->global_txn.handle = NULL;
    if (atomic_get_uint64_t(&file->pos)) {
        file->global_txn.prev_hdr_bid =
            (atomic_get_uint64_t(&file->pos) / file->blocksize) - 1;
    } else {
        file->global_txn.prev_hdr_bid = BLK_NOT_FOUND;
    }
    file->global_txn.prev_revnum = 0;
    file->global_txn.items = (struct list *)malloc(sizeof(struct list));
    list_init(file->global_txn.items);
    file->global_txn.isolation = FDB_ISOLATION_READ_COMMITTED;
    wal_add_transaction(file, &file->global_txn);

    hash_insert(&hash, &file->e);
    if (config->prefetch_duration > 0) {
        filemgr_prefetch(file, config, log_callback);
    }

    spin_unlock(&filemgr_openlock);

    if (config->options & FILEMGR_SYNC) {
        file->fflags |= FILEMGR_SYNC;
    } else {
        file->fflags &= ~FILEMGR_SYNC;
    }

    result.file = file;
    result.rv = FDB_RESULT_SUCCESS;
    fdb_log(log_callback, FDB_LOG_INFO, FDB_RESULT_SUCCESS,
            "Forestdb opened database file %s, ref count %zu",
            filename,
            atomic_get_uint32_t(&file->ref_count));

    return result;
}